

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

Operand * translateRegister(Operand *__return_storage_ptr__,Operand *reg)

{
  uint uVar1;
  
  uVar1 = reg->reg_num - 0x10;
  if ((uVar1 < 8) && ((0xf3U >> (uVar1 & 0x1f) & 1) != 0)) {
    reg = *(Operand **)(&DAT_00124d10 + (ulong)uVar1 * 8);
  }
  Operand::Operand(__return_storage_ptr__,reg);
  return __return_storage_ptr__;
}

Assistant:

static Operand translateRegister(const Operand reg) {
	switch (reg.reg_num) {
		case 0x10:
			return registers.a;
		case 0x11:
			return registers.b;
		case 0x14:
			return registers.bc;
		case 0x15:
			return registers.de;
		case 0x16:
			return registers.sp;
		case 0x17:
			return registers.iy;
	}
	return reg;
}